

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall
FastPForLib::FastPForTest_fastpack_min_max_Test::~FastPForTest_fastpack_min_max_Test
          (FastPForTest_fastpack_min_max_Test *this)

{
  void *in_RDI;
  
  ~FastPForTest_fastpack_min_max_Test((FastPForTest_fastpack_min_max_Test *)0x12e508);
  operator_delete(in_RDI,0x80);
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_min_max) {
    _genDataRandom(in32, 256);
    in32[0] = std::numeric_limits<int32_t>::min();
    in32[127] = std::numeric_limits<int32_t>::max();
    in32[128] = std::numeric_limits<int32_t>::min();
    in32[255] = std::numeric_limits<int32_t>::max();

    _verify();
    _copy64();
    _verify64();
  }